

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall SourceMapTest::parseMap(SourceMapTest *this,string *sourceMap)

{
  SourceMapReader *this_00;
  Module *pMVar1;
  allocator_type local_41;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  vector<char,_std::allocator<char>_> local_30;
  string *local_18;
  string *sourceMap_local;
  SourceMapTest *this_local;
  
  local_18 = sourceMap;
  sourceMap_local = (string *)this;
  local_38._M_current = (char *)std::__cxx11::string::begin();
  local_40._M_current = (char *)std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::vector<char,std::allocator<char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<char,std::allocator<char>> *)&local_30,local_38,local_40,&local_41);
  std::vector<char,_std::allocator<char>_>::operator=(&this->buffer,&local_30);
  std::vector<char,_std::allocator<char>_>::~vector(&local_30);
  std::allocator<char>::~allocator(&local_41);
  this_00 = (SourceMapReader *)operator_new(0x40);
  ::wasm::SourceMapReader::SourceMapReader(this_00,&this->buffer);
  std::unique_ptr<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>::reset
            (&this->reader,this_00);
  pMVar1 = (Module *)
           std::unique_ptr<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>::
           operator->(&this->reader);
  ::wasm::SourceMapReader::parse(pMVar1);
  return;
}

Assistant:

void parseMap(std::string& sourceMap) {
    buffer = {sourceMap.begin(), sourceMap.end()};
    reader.reset(new SourceMapReader(buffer));
    reader->parse(wasm);
  }